

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void assert_same_file(char *file1,char *file2,bool expected)

{
  bool bVar1;
  ostream *poVar2;
  char *local_50;
  char *local_40;
  char *local_30;
  bool actual;
  bool expected_local;
  char *file2_local;
  char *file1_local;
  
  bVar1 = QUtil::same_file(file1,file2);
  poVar2 = std::operator<<((ostream *)&std::cout,"file1: -");
  local_30 = file1;
  if (file1 == (char *)0x0) {
    local_30 = "(null)";
  }
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2,"-, file2: -");
  local_40 = file2;
  if (file2 == (char *)0x0) {
    local_40 = "(null)";
  }
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2,"-; same: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  poVar2 = std::operator<<(poVar2,": ");
  if (bVar1 == expected) {
    local_50 = "PASS";
  }
  else {
    local_50 = "FAIL";
  }
  poVar2 = std::operator<<(poVar2,local_50);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
assert_same_file(char const* file1, char const* file2, bool expected)
{
    bool actual = QUtil::same_file(file1, file2);
    std::cout << "file1: -" << (file1 ? file1 : "(null)") << "-, file2: -"
              << (file2 ? file2 : "(null)") << "-; same: " << actual << ": "
              << ((actual == expected) ? "PASS" : "FAIL") << std::endl;
}